

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoCube.h
# Opt level: O0

void pzgeom::TPZGeoCube::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  int64_t iVar2;
  TPZFMatrix<double> *this;
  double *pdVar3;
  TPZVec<double> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<24,_double> dphi;
  TPZFNMatrix<8,_double> phi;
  double in_stack_fffffffffffffd80;
  double *in_stack_fffffffffffffd88;
  TPZFNMatrix<24,_double> *in_stack_fffffffffffffd90;
  int local_260;
  int local_25c;
  TPZFMatrix<double> *in_stack_fffffffffffffee0;
  TPZFMatrix<double> *in_stack_fffffffffffffee8;
  TPZVec<double> *in_stack_fffffffffffffef0;
  
  TPZFNMatrix<8,_double>::TPZFNMatrix
            ((TPZFNMatrix<8,_double> *)in_stack_fffffffffffffd90,(int64_t)in_stack_fffffffffffffd88,
             (int64_t)in_stack_fffffffffffffd80);
  TPZFNMatrix<24,_double>::TPZFNMatrix
            (in_stack_fffffffffffffd90,(int64_t)in_stack_fffffffffffffd88,
             (int64_t)in_stack_fffffffffffffd80);
  pztopology::TPZCube::TShape<double>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  iVar2 = TPZBaseMatrix::Rows(in_RDI);
  for (local_25c = 0; local_25c < (int)iVar2; local_25c = local_25c + 1) {
    this = (TPZFMatrix<double> *)TPZVec<double>::operator[](in_RDX,(long)local_25c);
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)0x0;
    for (local_260 = 0; local_260 < 8; local_260 = local_260 + 1) {
      in_stack_fffffffffffffd88 =
           TPZFMatrix<double>::operator()
                     (this,(int64_t)in_stack_fffffffffffffd88,(int64_t)in_stack_fffffffffffffd80);
      dVar1 = *in_stack_fffffffffffffd88;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_25c,(long)local_260);
      in_stack_fffffffffffffd80 = extraout_XMM0_Qa;
      pdVar3 = TPZVec<double>::operator[](in_RDX,(long)local_25c);
      *pdVar3 = dVar1 * in_stack_fffffffffffffd80 + *pdVar3;
    }
  }
  TPZFNMatrix<24,_double>::~TPZFNMatrix((TPZFNMatrix<24,_double> *)0x161644e);
  TPZFNMatrix<8,_double>::~TPZFNMatrix((TPZFNMatrix<8,_double> *)0x161645b);
  return;
}

Assistant:

inline void TPZGeoCube::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<8,T> phi(NNodes,1);
        TPZFNMatrix<24,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < NNodes; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }